

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall
sjtu::TrainManager::query_transfer_cmp<sjtu::cmp_cost>
          (TrainManager *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *station,timeType *date)

{
  undefined1 *this_00;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pair<unsigned_int,_bool> pVar6;
  pair<unsigned_int,_bool> pVar7;
  ostream *poVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  hashType hVar9;
  undefined4 extraout_var_02;
  ulong uVar10;
  trainType *ptVar11;
  uint w_;
  hashType hVar12;
  uint uVar13;
  int k;
  trainType *ptVar14;
  long lVar15;
  allocator local_1b69;
  timeType *local_1b68;
  trainType *local_1b60;
  long local_1b58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b50;
  ulong local_1b48;
  timeType local_1b40;
  uint local_1b2c;
  long local_1b28;
  timeType *local_1b20;
  locType offset;
  StringHasher *local_1b10;
  ulong local_1b08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b00;
  undefined1 local_1af8 [64];
  char local_1ab8 [32];
  hashType local_1a98;
  int iStack_1a90;
  int iStack_1a8c;
  hashType local_1a88 [2];
  undefined8 local_1a78;
  uint local_1a70;
  undefined1 local_1a68 [64];
  string local_1a28 [32];
  hashType local_1a08;
  int iStack_1a00;
  int iStack_19fc;
  int local_19e8;
  string local_19d8;
  string local_19b8;
  string local_1998;
  string local_1978;
  pair<sjtu::recordType,_sjtu::recordType> ans;
  uint bits [3] [512];
  undefined7 extraout_var;
  undefined4 extraout_var_03;
  
  pBVar1 = this->StationBpTree;
  this_00 = &this->field_0x10;
  local_1b20 = date;
  std::__cxx11::string::string((string *)&local_1998,(string *)station);
  bits[0]._0_8_ = StringHasher::operator()((StringHasher *)this_00,&local_1998);
  pVar6 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                    (pBVar1,(unsigned_long_long *)bits);
  std::__cxx11::string::~string((string *)&local_1998);
  pBVar1 = this->StationBpTree;
  local_1b00 = station + 1;
  local_1b50 = station;
  std::__cxx11::string::string((string *)&local_19b8,(string *)local_1b00);
  bits[0]._0_8_ = StringHasher::operator()((StringHasher *)this_00,&local_19b8);
  pVar7 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                    (pBVar1,(unsigned_long_long *)bits);
  std::__cxx11::string::~string((string *)&local_19b8);
  if (((ulong)pVar7 >> 0x20 & 1) == 0 || ((ulong)pVar6 >> 0x20 & 1) == 0) {
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    local_1b10 = (StringHasher *)this_00;
    bitset_query(this,pVar6.first,bits[0]);
    bitset_query(this,pVar7.first,bits[1]);
    std::pair<sjtu::recordType,_sjtu::recordType>::pair<sjtu::recordType,_sjtu::recordType,_true>
              (&ans);
    local_1b28 = 0;
    local_1b48 = 0;
    lVar15 = 0;
    while (lVar15 != 0x200) {
      uVar13 = bits[0][lVar15];
      local_1b58 = lVar15;
      while (uVar13 != 0) {
        local_1b2c = -uVar13 & uVar13;
        lVar15 = local_1b28;
        uVar5 = local_1b2c;
        if (local_1b2c != 0) {
          for (; uVar5 != 0; uVar5 = uVar5 >> 1) {
            lVar15 = lVar15 + 0xa7a8;
          }
          offset = lVar15;
          iVar3 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                    _vptr_FileManager_Base[2])(this->TrainFile,&offset);
          local_1b60 = (trainType *)CONCAT44(extraout_var_00,iVar3);
          local_1b68 = local_1b60->saleDate;
          iVar3 = timeType::dateminus(local_1b20,local_1b68);
          std::__cxx11::string::string((string *)&local_19d8,(string *)local_1b50);
          ptVar11 = local_1b60;
          iVar4 = trainType::get_Delta_date(local_1b60,&local_19d8);
          std::__cxx11::string::~string((string *)&local_19d8);
          uVar13 = iVar4 + iVar3;
          if ((-1 < (int)uVar13 && ptVar11->is_released != false) &&
             (iVar3 = timeType::dateminus(ptVar11->saleDate + 1,local_1b68), (int)uVar13 <= iVar3))
          {
            std::pair<sjtu::recordType,_sjtu::recordType>::
            pair<sjtu::recordType,_sjtu::recordType,_true>
                      ((pair<sjtu::recordType,_sjtu::recordType> *)local_1af8);
            std::__cxx11::string::assign((char *)local_1af8);
            std::__cxx11::string::_M_assign((string *)(local_1af8 + 0x20));
            local_1a88[0]._0_4_ = (local_1b60->startTime).month;
            local_1a88[0]._4_4_ = (local_1b60->startTime).day;
            local_1a88[1]._0_4_ = (local_1b60->startTime).hour;
            local_1a88[1]._4_4_ = (local_1b60->startTime).minute;
            local_1a98._0_4_ = (local_1b60->startTime).month;
            local_1a98._4_4_ = (local_1b60->startTime).day;
            iStack_1a90 = (local_1b60->startTime).hour;
            iStack_1a8c = (local_1b60->startTime).minute;
            local_1a78._0_4_ = 0;
            local_1a78._4_4_ = 100000;
            local_1a70 = 0;
            local_1b08 = (ulong)uVar13;
            local_1b68 = (timeType *)0x0;
            ptVar11 = local_1b60;
            for (ptVar14 = (trainType *)0x0; (long)ptVar14 < (long)ptVar11->stationNum;
                ptVar14 = (trainType *)(ptVar14->trainID + 1)) {
              iVar3 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                        _vptr_FileManager_Base[2])(this->TrainFile,&offset);
              if (ptVar14 != (trainType *)0x0) {
                timeType::operator+(&local_1b40,(int *)local_1a88);
                local_1a88[0]._0_4_ = local_1b40.month;
                local_1a88[0]._4_4_ = local_1b40.day;
                local_1a88[1]._0_4_ = local_1b40.hour;
                local_1a88[1]._4_4_ = local_1b40.minute;
                local_1a70 = local_1a70 +
                             (uint)((byte)local_1b68 & 1) *
                             *(int *)((long)ptVar14 * 0x1a8 + CONCAT44(extraout_var_01,iVar3) +
                                     0x1c4);
              }
              if (((ulong)local_1b68 & 1) != 0) {
                lVar15 = (long)ptVar14 * 0x1a8 + CONCAT44(extraout_var_01,iVar3);
                std::__cxx11::string::assign(local_1ab8);
                iVar3 = *(int *)(lVar15 + 0x4c + local_1b08 * 4);
                if (local_1a78._4_4_ < iVar3) {
                  iVar3 = local_1a78._4_4_;
                }
                local_1a78._4_4_ = iVar3;
                local_1a78._0_4_ = (int)local_1a78 + *(int *)(lVar15 + 0x1bc);
                pBVar1 = this->StationBpTree;
                local_1b60 = ptVar14;
                std::__cxx11::string::string
                          ((string *)&local_1978,(char *)(lVar15 + 0x20),&local_1b69);
                local_1b40._0_8_ = StringHasher::operator()(local_1b10,&local_1978);
                pVar6 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                        ::find(pBVar1,(unsigned_long_long *)&local_1b40);
                bitset_query(this,pVar6.first,bits[2]);
                std::__cxx11::string::~string((string *)&local_1978);
                hVar12 = 0;
                for (lVar15 = 0; ptVar14 = local_1b60, lVar15 != 0x200; lVar15 = lVar15 + 1) {
                  for (uVar13 = bits[2][lVar15] & bits[1][lVar15]; bits[2][lVar15] = uVar13,
                      uVar13 != 0; uVar13 = uVar13 ^ bits[2][lVar15]) {
                    uVar13 = -uVar13 & uVar13;
                    hVar9 = hVar12;
                    uVar5 = uVar13;
                    if (uVar13 != 0) {
                      for (; uVar5 != 0; uVar5 = uVar5 >> 1) {
                        hVar9 = hVar9 + 0xa7a8;
                      }
                      local_1b40._0_8_ = hVar9;
                      iVar3 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                                _vptr_FileManager_Base[2])(this->TrainFile,&local_1b40);
                      bVar2 = std::operator==((char *)CONCAT44(extraout_var_02,iVar3),
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1af8);
                      if (!bVar2) {
                        std::__cxx11::string::_M_assign((string *)(local_1a68 + 0x20));
                        std::__cxx11::string::_M_assign(local_1a28);
                        std::__cxx11::string::assign(local_1a68);
                        local_1a08 = local_1a88[0];
                        iStack_1a00 = (int)local_1a88[1];
                        iStack_19fc = local_1a88[1]._4_4_;
                        bVar2 = trainType::getrecord
                                          ((trainType *)CONCAT44(extraout_var_02,iVar3),
                                           (recordType *)local_1a68,true);
                        uVar10 = CONCAT71(extraout_var,bVar2);
                        if (bVar2) {
                          if ((local_1b48 & 1) != 0) {
                            uVar5 = local_19e8 + (int)local_1a78;
                            uVar10 = (ulong)uVar5;
                            if ((ans.second.price + ans.first.price <= (int)uVar5) &&
                               ((uVar5 != ans.second.price + ans.first.price ||
                                (uVar10 = (ulong)local_1a70, ans.first.duration <= (int)local_1a70))
                               )) goto LAB_0010c51e;
                          }
                          local_1b48 = CONCAT71((int7)(uVar10 >> 8),1);
                          std::pair<sjtu::recordType,_sjtu::recordType>::operator=
                                    (&ans,(type)local_1af8);
                        }
                      }
                    }
LAB_0010c51e:
                  }
                  hVar12 = hVar12 + 0x14f500;
                }
              }
              iVar3 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                        _vptr_FileManager_Base[2])();
              ptVar11 = (trainType *)CONCAT44(extraout_var_03,iVar3);
              if (ptVar14 != (trainType *)0x0) {
                timeType::operator+(&local_1b40,(int *)local_1a88);
                local_1a88[0]._0_4_ = local_1b40.month;
                local_1a88[0]._4_4_ = local_1b40.day;
                local_1a88[1]._0_4_ = local_1b40.hour;
                local_1a88[1]._4_4_ = local_1b40.minute;
                local_1a70 = local_1a70 +
                             (uint)((byte)local_1b68 & 1) *
                             ptVar11->stations[(long)ptVar14].stopoverTime;
              }
              bVar2 = std::operator==(ptVar11->stations[(long)ptVar14].stationName,local_1b50);
              if (bVar2) {
                local_1a98._0_4_ = local_1b20->month;
                local_1a98._4_4_ = local_1b20->day;
                iStack_1a90 = (int)local_1a88[1];
                iStack_1a8c = local_1a88[1]._4_4_;
                local_1b68 = (timeType *)CONCAT71((int7)(local_1a98 >> 8),1);
                local_1a88[0] = local_1a98;
              }
            }
            std::pair<sjtu::recordType,_sjtu::recordType>::~pair
                      ((pair<sjtu::recordType,_sjtu::recordType> *)local_1af8);
          }
          uVar13 = bits[0][local_1b58];
        }
        uVar13 = uVar13 ^ local_1b2c;
        bits[0][local_1b58] = uVar13;
      }
      local_1b28 = local_1b28 + 0x14f500;
      lVar15 = local_1b58 + 1;
    }
    if ((local_1b48 & 1) == 0) {
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
    }
    else {
      poVar8 = operator<<((ostream *)&std::cout,&ans.first);
      poVar8 = std::endl<char,std::char_traits<char>>(poVar8);
      poVar8 = operator<<(poVar8,&ans.second);
    }
    std::endl<char,std::char_traits<char>>(poVar8);
    std::pair<sjtu::recordType,_sjtu::recordType>::~pair(&ans);
  }
  return;
}

Assistant:

void query_transfer_cmp(std::string station[] , timeType date , Compare comp)
		{
			auto ret_s = StationBpTree -> find(hasher(station[0])) , ret_t = StationBpTree -> find(hasher(station[1]));
			if (ret_s.second == false || ret_t.second == false) std::cout << 0 << std::endl;
			else
			{
				unsigned int bits[3][WS];		
				bitset_query(ret_s.first , bits[0]) , bitset_query(ret_t.first , bits[1]);
				std::pair<recordType , recordType> ans;bool found = false;
				for (int i = 0;i < WS;++ i)
					for (unsigned int w;bits[0][i];bits[0][i] ^= w)
					{
						w = bits[0][i] & (-bits[0][i]);
						if (!w) continue;
						int id = -1;
						for (unsigned int w_ = w;w_;w_ >>= 1) ++ id;
						locType offset = (i * W + id + 1) * sizeof (DynamicFileManager<trainType>::valueType);
						trainType *train = TrainFile -> read(offset);
						int day_id = timeType::dateminus(date , train -> saleDate[0]) + train -> get_Delta_date(station[0]);
						if (train -> is_released == false || day_id < 0 || day_id > timeType::dateminus(train -> saleDate[1] , train -> saleDate[0])) continue;
						std::pair<recordType , recordType> cur;
						cur.first.trainID = train -> trainID , cur.first.station[0] = station[0] , cur.first.time[0] = cur.first.time[1] = train -> startTime;
						cur.first.seat = 100000 , cur.first.price = 0 , cur.first.duration = 0;
						bool flag = false;
						for (int j = 0 , stationNum = train -> stationNum;j < train -> stationNum;++ j)
						{
							train = TrainFile -> read(offset);
							if (j) cur.first.time[1] = cur.first.time[1] + train -> stations[j].travelTime , cur.first.duration += flag * (train -> stations[j].travelTime);
							if (flag)
							{
								cur.first.station[1] = train -> stations[j].stationName;
								cur.first.seat = min(cur.first.seat , train -> stations[j].seatNum[day_id]) , cur.first.price += train -> stations[j].price;
								bitset_query(StationBpTree -> find(hasher(train -> stations[j].stationName)).first , bits[2]);
								for (int k = 0;k < WS;++ k)
								{
									bits[2][k] &= bits[1][k];
									for (unsigned int v;bits[2][k];bits[2][k] ^= v)
									{
										v = bits[2][k] & (-bits[2][k]);
										if (!v) continue;
										int id_ = -1;
										for (unsigned int v_ = v;v_;v_ >>= 1) ++ id_;
										trainType *train_ = TrainFile -> read((k * W + id_ + 1) * sizeof (DynamicFileManager<trainType>::valueType));
										if (train_ -> trainID == cur.first.trainID) continue;
										cur.second.station[0] = cur.first.station[1] , cur.second.station[1] = station[1];
										cur.second.trainID = train_ -> trainID , cur.second.time[0] = cur.first.time[1];
										if (train_ -> getrecord(&cur.second , true)) if (!found || comp(cur , ans)) ans = cur , found = true;
									}
								}
							}
							train = TrainFile -> read(offset);
							if (j) cur.first.time[1] = cur.first.time[1] + train -> stations[j].stopoverTime , cur.first.duration += flag * (train -> stations[j].stopoverTime);
							if (train -> stations[j].stationName == station[0])
							{
								flag = true;
								cur.first.time[1].month = cur.first.time[0].month = date.month;
								cur.first.time[0].hour = cur.first.time[1].hour , cur.first.time[0].minute = cur.first.time[1].minute;
								cur.first.time[1].day = cur.first.time[0].day = date.day;
							}
						}
					}
				if (!found) std::cout << 0 << std::endl;
				else std::cout << ans.first << std::endl << ans.second << std::endl;
			}
		}